

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O1

void P_SpawnSlopeMakers(FMapThing *firstmt,FMapThing *lastmt,int *oldvertextable)

{
  Node *y;
  double dVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  FDoomEdEntry *pFVar6;
  sector_t_conflict *psVar7;
  line_t_conflict *plVar8;
  line_t_conflict *plVar9;
  vertex_t *pvVar10;
  vertex_t *pvVar11;
  long lVar12;
  bool bVar13;
  splane *psVar14;
  long *plVar15;
  uint uVar16;
  subsector_t *psVar17;
  Node *pNVar18;
  double *pdVar19;
  secplane_t *psVar20;
  long *plVar21;
  double *pdVar22;
  FMapThing *pFVar23;
  vertex_t *pvVar24;
  uint uVar25;
  long lVar26;
  long *plVar27;
  TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *this;
  double *pdVar28;
  uint uVar29;
  long *plVar30;
  int iVar31;
  long lVar32;
  uint uVar33;
  bool bVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  DVector3 pos;
  FLineIdIterator local_c0;
  undefined1 local_b8 [20];
  undefined4 uStack_a4;
  TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> local_a0;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  long local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pFVar23 = firstmt;
  if (firstmt < lastmt) {
    do {
      pFVar6 = pFVar23->info;
      if (((pFVar6 != (FDoomEdEntry *)0x0) && (pFVar6->Type == (PClassActor *)0x0)) &&
         (uVar3 = pFVar6->Special, (ushort)(uVar3 - 0xf) < 6)) {
        pNVar18 = (Node *)(pFVar23->pos).X;
        y = (Node *)(pFVar23->pos).Y;
        unique0x00006b80 = (pFVar23->pos).Z;
        local_b8._0_8_ = pNVar18;
        local_b8._8_8_ = y;
        psVar17 = P_PointInSubsector((double)pNVar18,(double)y);
        uVar2 = pFVar23->info->Special;
        if ((uVar2 < 0x15) && ((0x150000U >> (uVar2 & 0x1f) & 1) != 0)) {
          iVar31 = 1;
          lVar26 = 0xd8;
        }
        else {
          lVar26 = 0xb0;
          iVar31 = 0;
        }
        psVar7 = psVar17->sector;
        dVar38 = ((pFVar23->pos).Y * *(double *)((long)&psVar7->planes[0].xform.yOffs + lVar26) +
                 (pFVar23->pos).X * *(double *)((long)&psVar7->planes[0].xform.xOffs + lVar26) +
                 *(double *)((long)&psVar7->planes[0].xform.xScale + lVar26)) *
                 *(double *)((long)&psVar7->planes[0].xform.yScale + lVar26) + (pFVar23->pos).Z;
        bVar34 = SUB41(iVar31,0);
        unique0x1000103f = dVar38;
        if ((short)uVar2 < 0x11) {
          local_c0.searchtag = pFVar23->args[0];
          local_c0.start = tagManager.IDHashFirst[local_c0.searchtag & 0xff];
          uVar16 = FLineIdIterator::Next(&local_c0);
          if (-1 < (int)uVar16) {
            lVar26 = 0xb0;
            if (bVar34 != false) {
              lVar26 = 0xd8;
            }
            do {
              dVar35 = ((lines[uVar16].v1)->p).X;
              dVar40 = ((lines[uVar16].v1)->p).Y;
              dVar39 = (double)y - dVar40;
              dVar36 = lines[uVar16].delta.X;
              dVar43 = dVar39 * dVar36;
              dVar37 = lines[uVar16].delta.Y;
              dVar41 = lines[uVar16].bbox
                       [(ulong)(1.52587890625e-05 < (dVar35 - (double)pNVar18) * dVar37 + dVar43) +
                        4];
              if (dVar41 == 0.0) {
                bVar13 = false;
              }
              else {
                dVar44 = *(double *)((long)dVar41 + 0x18 + lVar26);
                dVar42 = *(double *)((long)dVar41 + 8 + lVar26);
                dVar1 = *(double *)((long)dVar41 + 0x20 + lVar26);
                dVar40 = (dVar40 * dVar42 + dVar35 * *(double *)((long)dVar41 + lVar26) + dVar44) *
                         dVar1;
                dVar44 = (dVar42 * ((lines[uVar16].v2)->p).Y +
                         *(double *)((long)dVar41 + lVar26) * ((lines[uVar16].v2)->p).X + dVar44) *
                         dVar1 - dVar40;
                dVar40 = dVar38 - dVar40;
                local_78 = dVar37 * dVar40 - dVar39 * dVar44;
                local_68 = dVar44 * ((double)pNVar18 - dVar35) - dVar36 * dVar40;
                local_88 = dVar43 - ((double)pNVar18 - dVar35) * dVar37;
                uStack_80 = 0;
                uStack_70 = 0;
                uStack_60 = 0;
                dVar35 = c_sqrt(local_88 * local_88 + local_68 * local_68 + local_78 * local_78);
                if ((dVar35 != 0.0) || (NAN(dVar35))) {
                  dVar35 = 1.0 / dVar35;
                  dVar37 = local_78 * dVar35;
                  dVar40 = local_88 * dVar35;
                  dVar36 = -dVar40;
                  dVar35 = local_68 * dVar35;
                  bVar13 = dVar40 < dVar36;
                  if (bVar34 != false) {
                    bVar13 = dVar36 < dVar40;
                  }
                  if (bVar13) {
                    dVar37 = -dVar37;
                    dVar35 = -dVar35;
                    dVar40 = dVar36;
                  }
                  *(double *)((long)dVar41 + lVar26) = dVar37;
                  *(double *)((long)dVar41 + 8 + lVar26) = dVar35;
                  *(double *)((long)dVar41 + 0x10 + lVar26) = dVar40;
                  *(double *)((long)dVar41 + 0x18 + lVar26) =
                       (-dVar37 * (double)pNVar18 - (double)y * dVar35) - dVar38 * dVar40;
                  *(double *)((long)dVar41 + 0x20 + lVar26) = -1.0 / dVar40;
                  bVar13 = false;
                }
                else {
                  Printf("Slope thing at (%f,%f) lies directly on its target line.\n",pNVar18,y);
                  bVar13 = true;
                }
              }
            } while ((!bVar13) && (uVar16 = FLineIdIterator::Next(&local_c0), -1 < (int)uVar16));
          }
        }
        else if (uVar2 < 0x13) {
          P_SetSlope((secplane_t *)((long)&psVar7->planes[0].xform.xOffs + lVar26),bVar34,
                     (int)pFVar23->angle,pFVar23->args[0],(DVector3 *)local_b8);
        }
        else {
          P_VavoomSlope(psVar7,pFVar23->thingid,&pFVar23->pos,iVar31);
        }
        pFVar23->EdNum = 0;
      }
      pFVar23 = pFVar23 + 1;
    } while (pFVar23 < lastmt);
  }
  pFVar23 = firstmt;
  if (firstmt < lastmt) {
    do {
      pFVar6 = pFVar23->info;
      if (((pFVar6 != (FDoomEdEntry *)0x0) && (pFVar6->Type == (PClassActor *)0x0)) &&
         (uVar4 = pFVar6->Special, (ushort)(uVar4 - 0x15) < 2)) {
        iVar31 = pFVar23->args[0];
        psVar17 = P_PointInSubsector((pFVar23->pos).X,(pFVar23->pos).Y);
        P_CopyPlane(iVar31,psVar17->sector,uVar4 == 0x16);
        pFVar23->EdNum = 0;
      }
      pFVar23 = pFVar23 + 1;
    } while (pFVar23 < lastmt);
  }
  lVar26 = 0;
  do {
    *(undefined4 *)((long)&uStack_a4 + lVar26) = 0;
    TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::SetNodeVector
              ((TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)(local_b8 + lVar26),1);
    lVar26 = lVar26 + 0x18;
  } while (lVar26 != 0x30);
  bVar34 = false;
  if (firstmt < lastmt) {
    do {
      pFVar6 = firstmt->info;
      if (((pFVar6 != (FDoomEdEntry *)0x0) && (pFVar6->Type == (PClassActor *)0x0)) &&
         (uVar5 = pFVar6->Special, (ushort)(uVar5 - 0x17) < 2)) {
        if (0 < numvertexes) {
          lVar32 = 8;
          lVar26 = 0;
          do {
            dVar38 = *(double *)((long)vertexes + lVar32 + -8);
            if ((dVar38 == (firstmt->pos).X) && (!NAN(dVar38) && !NAN((firstmt->pos).X))) {
              dVar38 = *(double *)((long)&(vertexes->p).X + lVar32);
              pdVar19 = &(firstmt->pos).Y;
              if ((dVar38 == *pdVar19) && (!NAN(dVar38) && !NAN(*pdVar19))) {
                dVar38 = (firstmt->pos).Z;
                this = &local_a0;
                if (firstmt->info->Special == 0x17) {
                  this = (TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)local_b8;
                }
                pNVar18 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                                    (this,(int)lVar26);
                (pNVar18->Pair).Value = dVar38;
                bVar34 = true;
              }
            }
            lVar26 = lVar26 + 1;
            lVar32 = lVar32 + 0x10;
          } while (lVar26 < numvertexes);
        }
        firstmt->EdNum = 0;
      }
      firstmt = firstmt + 1;
    } while (firstmt < lastmt);
  }
  if (0 < numvertexdatas) {
    lVar26 = 4;
    lVar32 = 0;
    do {
      if (oldvertextable == (int *)0x0) {
        iVar31 = (int)lVar32;
      }
      else {
        iVar31 = oldvertextable[lVar32];
      }
      if ((*(byte *)((long)&vertexdatas->zCeiling + lVar26 * 4) & 1) != 0) {
        dVar38 = *(double *)((long)vertexdatas + lVar26 * 4 + -0x10);
        pNVar18 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                            (&local_a0,iVar31);
        (pNVar18->Pair).Value = dVar38;
        bVar34 = true;
      }
      if ((*(byte *)((long)&vertexdatas->zCeiling + lVar26 * 4) & 2) != 0) {
        dVar38 = *(double *)((long)vertexdatas + lVar26 * 4 + -8);
        pNVar18 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                            ((TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)local_b8,
                             iVar31);
        (pNVar18->Pair).Value = dVar38;
        bVar34 = true;
      }
      lVar32 = lVar32 + 1;
      lVar26 = lVar26 + 6;
    } while (lVar32 < numvertexdatas);
  }
  if (vertexdatas != (vertexdata_t *)0x0) {
    operator_delete__(vertexdatas);
  }
  vertexdatas = (vertexdata_t *)0x0;
  numvertexdatas = 0;
  if ((bVar34) && (0 < numsectors)) {
    lVar26 = 0;
    do {
      psVar7 = sectors;
      local_50 = lVar26;
      if (sectors[lVar26].linecount == 3) {
        plVar8 = *sectors[lVar26].lines;
        plVar9 = sectors[lVar26].lines[1];
        pvVar10 = plVar8->v1;
        pvVar11 = plVar8->v2;
        pvVar24 = plVar9->v1;
        if (pvVar24 == pvVar11 || pvVar24 == pvVar10) {
          pvVar24 = plVar9->v2;
        }
        uVar25 = (uint)((ulong)((long)pvVar10 - (long)vertexes) >> 4);
        dVar38 = vertexes[(int)uVar25].p.X;
        dVar35 = vertexes[(int)uVar25].p.Y;
        uVar33 = (uint)((ulong)((long)pvVar11 - (long)vertexes) >> 4);
        dVar40 = vertexes[(int)uVar33].p.X;
        dVar36 = vertexes[(int)uVar33].p.Y;
        uVar16 = (uint)((ulong)((long)pvVar24 - (long)vertexes) >> 4);
        local_40 = vertexes[(int)uVar16].p.X;
        local_48 = vertexes[(int)uVar16].p.Y;
        lVar32 = 0;
        do {
          lVar12 = *(long *)(local_b8 + lVar32 * 0x18);
          uVar29 = *(int *)(local_b8 + lVar32 * 0x18 + 0x10) - 1;
          plVar15 = (long *)(lVar12 + (ulong)(uVar29 & uVar25) * 0x18);
          do {
            plVar21 = plVar15;
            if ((plVar21 == (long *)0x0) || ((long *)*plVar21 == (long *)0x1)) {
              plVar21 = (long *)0x0;
              break;
            }
            plVar15 = (long *)*plVar21;
          } while (*(uint *)(plVar21 + 1) != uVar25);
          plVar15 = (long *)(lVar12 + (ulong)(uVar29 & uVar33) * 0x18);
          do {
            plVar27 = plVar15;
            if ((plVar27 == (long *)0x0) || ((long *)*plVar27 == (long *)0x1)) {
              plVar27 = (long *)0x0;
              break;
            }
            plVar15 = (long *)*plVar27;
          } while (*(uint *)(plVar27 + 1) != uVar33);
          plVar15 = (long *)(lVar12 + (ulong)(uVar29 & uVar16) * 0x18);
          do {
            plVar30 = plVar15;
            if ((plVar30 == (long *)0x0) || ((long *)*plVar30 == (long *)0x1)) {
              plVar30 = (long *)0x0;
              break;
            }
            plVar15 = (long *)*plVar30;
          } while (*(uint *)(plVar30 + 1) != uVar16);
          if (((plVar21 != (long *)0x0) || (plVar27 != (long *)0x0)) || (plVar30 != (long *)0x0)) {
            psVar14 = psVar7[lVar26].planes;
            if (lVar32 != 0) {
              psVar14 = psVar7[lVar26].planes + 1;
            }
            pdVar28 = &psVar14->TexZ;
            pdVar19 = (double *)(plVar21 + 2);
            if (plVar21 == (long *)0x0) {
              pdVar19 = pdVar28;
            }
            pdVar22 = (double *)(plVar27 + 2);
            if (plVar27 == (long *)0x0) {
              pdVar22 = pdVar28;
            }
            if (plVar30 != (long *)0x0) {
              pdVar28 = (double *)(plVar30 + 2);
            }
            plVar8 = *psVar7[lVar26].lines;
            dVar39 = ((plVar8->v1->p).X - vertexes[(int)uVar16].p.X) * (plVar8->delta).Y +
                     (vertexes[(int)uVar16].p.Y - (plVar8->v1->p).Y) * (plVar8->delta).X;
            dVar37 = dVar38;
            dVar41 = dVar35;
            if (1.52587890625e-05 < dVar39) {
              dVar37 = dVar40;
              dVar41 = dVar36;
            }
            dVar43 = dVar40;
            dVar44 = dVar36;
            dVar42 = *pdVar22;
            if (1.52587890625e-05 < dVar39) {
              dVar43 = dVar38;
              dVar44 = dVar35;
              dVar42 = *pdVar19;
            }
            local_78 = *pdVar28;
            dVar39 = (double)(~-(ulong)(dVar39 <= 1.52587890625e-05) & (ulong)*pdVar22 |
                             (ulong)*pdVar19 & -(ulong)(dVar39 <= 1.52587890625e-05)) - local_78;
            local_88 = (dVar44 - local_48) * dVar39 - (dVar42 - local_78) * (dVar41 - local_48);
            local_68 = (dVar42 - local_78) * (dVar37 - local_40) - dVar39 * (dVar43 - local_40);
            local_38 = (dVar41 - local_48) * (dVar43 - local_40) -
                       (dVar37 - local_40) * (dVar44 - local_48);
            uStack_80 = 0;
            uStack_60 = 0;
            dVar37 = c_sqrt(local_38 * local_38 + local_68 * local_68 + local_88 * local_88);
            if ((dVar37 != 0.0) || (NAN(dVar37))) {
              dVar37 = 1.0 / dVar37;
              dVar39 = local_88 * dVar37;
              dVar41 = local_68 * dVar37;
              dVar37 = dVar37 * local_38;
              if (((lVar32 == 0) && (dVar37 < 0.0)) || ((lVar32 == 1 && (0.0 < dVar37)))) {
                dVar39 = -dVar39;
                dVar41 = -dVar41;
                dVar37 = -dVar37;
              }
              psVar20 = &psVar7[lVar26].ceilingplane;
              if (lVar32 == 0) {
                psVar20 = &psVar7[lVar26].floorplane;
              }
              dVar43 = vertexes[(int)uVar16].p.X;
              dVar44 = vertexes[(int)uVar16].p.Y;
              (psVar20->normal).X = dVar39;
              (psVar20->normal).Y = dVar41;
              (psVar20->normal).Z = dVar37;
              psVar20->D = (-dVar39 * dVar43 - dVar44 * dVar41) - local_78 * dVar37;
              psVar20->negiC = -1.0 / dVar37;
            }
          }
          bVar34 = lVar32 == 0;
          lVar32 = lVar32 + 1;
        } while (bVar34);
      }
      lVar26 = local_50 + 1;
    } while (lVar26 < numsectors);
  }
  lVar26 = 0x18;
  do {
    TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::~TMap
              ((TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)(local_b8 + lVar26));
    lVar26 = lVar26 + -0x18;
  } while (lVar26 != -0x18);
  return;
}

Assistant:

void P_SpawnSlopeMakers (FMapThing *firstmt, FMapThing *lastmt, const int *oldvertextable)
{
	FMapThing *mt;

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
		   (mt->info->Special >= SMT_SlopeFloorPointLine && mt->info->Special <= SMT_VavoomCeiling))
		{
			DVector3 pos = mt->pos;
			secplane_t *refplane;
			sector_t *sec;
			bool ceiling;

			sec = P_PointInSector (mt->pos);
			if (mt->info->Special == SMT_SlopeCeilingPointLine || mt->info->Special == SMT_VavoomCeiling || mt->info->Special == SMT_SetCeilingSlope)
			{
				refplane = &sec->ceilingplane;
				ceiling = true;
			}
			else
			{
				refplane = &sec->floorplane;
				ceiling = false;
			}
			pos.Z = refplane->ZatPoint (mt->pos) + mt->pos.Z;

			if (mt->info->Special <= SMT_SlopeCeilingPointLine)
			{ // SlopeFloorPointLine and SlopCeilingPointLine
				P_SlopeLineToPoint (mt->args[0], pos, ceiling);
			}
			else if (mt->info->Special <= SMT_SetCeilingSlope)
			{ // SetFloorSlope and SetCeilingSlope
				P_SetSlope (refplane, ceiling, mt->angle, mt->args[0], pos);
			}
			else 
			{ // VavoomFloor and VavoomCeiling (these do not perform any sector height adjustment - z is absolute)
				P_VavoomSlope(sec, mt->thingid, mt->pos, ceiling); 
			}
			mt->EdNum = 0;
		}
	}

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
			(mt->info->Special == SMT_CopyFloorPlane || mt->info->Special == SMT_CopyCeilingPlane))
		{
			P_CopyPlane (mt->args[0], mt->pos, mt->info->Special == SMT_CopyCeilingPlane);
			mt->EdNum = 0;
		}
	}

	P_SetSlopesFromVertexHeights(firstmt, lastmt, oldvertextable);
}